

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5f4c02::MLDSATest_KeyGenTests87_Test::TestBody
          (MLDSATest_KeyGenTests87_Test *this)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = 
  MLDSAKeyGenTest<BCM_mldsa87_private_key,_2592UL,_&BCM_mldsa87_generate_key_external_entropy,_&BCM_mldsa87_marshal_private_key>
  ;
  local_10 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_18 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("crypto/mldsa/mldsa_nist_keygen_87_tests.txt",
                (function<void_(FileTest_*)> *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

TEST(MLDSATest, KeyGenTests87) {
  FileTestGTest(
      "crypto/mldsa/mldsa_nist_keygen_87_tests.txt",
      MLDSAKeyGenTest<BCM_mldsa87_private_key, BCM_MLDSA87_PUBLIC_KEY_BYTES,
                      BCM_mldsa87_generate_key_external_entropy,
                      BCM_mldsa87_marshal_private_key>);
}